

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testTinySVD.cpp
# Opt level: O2

void testTinySVDImp<double>(void)

{
  Matrix44<double> local_228;
  Vec4<double> local_1a8;
  Vec4<double> local_188;
  Vec4<double> local_168;
  Vec4<double> local_148;
  Matrix44<double> local_128;
  Matrix44<double> local_a8;
  
  testTinySVD_3x3<double>(1.0,0.0,0.0,0.0,1.0,0.0,0.0,0.0,1.0);
  testTinySVD_3x3<double>(1.0,0.0,0.0,0.0,-1.0,0.0,0.0,0.0,1.0);
  testTinySVD_3x3<double>(0.0,0.0,0.0,0.0,0.0,0.0,0.0,0.0,0.0);
  testTinySVD_3x3<double>(0.0,0.0,0.0,0.0,0.0,0.0,0.0,0.0,1.0);
  testTinySVD_3x3<double>(1.0,0.0,0.0,0.0,1.0,0.0,0.0,0.0,0.0);
  testTinySVD_3x3<double>(1.0,0.0,0.0,0.0,0.0,0.0,0.0,0.0,0.0);
  testTinySVD_3x3<double>(1.0,0.0,0.0,1e-10,0.0,0.0,0.0,0.0,0.0);
  testTinySVD_3x3<double>(1.0,0.0,0.0,1e-10,0.0,0.0,0.0,0.0,100000.0);
  testTinySVD_3x3<double>(1.0,2.0,3.0,4.0,5.0,6.0,7.0,8.0,9.0);
  testTinySVD_3x3<double>(1.0,2.0,3.0,4.0,5.0,6.0,7.0,8.0,9.0);
  local_228.x[0][0] = 10000.0;
  local_228.x[0][1] = 0.001;
  local_228.x[0][2] = 0.0;
  local_228.x[0][3] = 0.001;
  local_228.x[1][0] = 1.0000000000000002e-10;
  local_228.x[1][1] = 0.0;
  local_228.x[1][2] = 0.0;
  local_228.x[1][3] = 0.0;
  local_228.x[2][0] = 0.0;
  testTinySVD_3x3<double>((Matrix33<double> *)&local_228);
  local_228.x[0][0] = 62720.0;
  local_228.x[0][1] = 73500.0;
  local_228.x[0][2] = 4900.0;
  local_228.x[0][3] = 5120.0;
  local_228.x[1][0] = 6000.0;
  local_228.x[1][1] = 400.0;
  local_228.x[1][2] = 256.0;
  local_228.x[1][3] = 300.0;
  local_228.x[2][0] = 20.0;
  testTinySVD_3x3<double>((Matrix33<double> *)&local_228);
  local_228.x[0][0] = 60026.0;
  local_228.x[0][1] = 4902.0;
  local_228.x[0][2] = 248.0;
  local_228.x[0][3] = 4902.0;
  local_228.x[1][0] = 404.0;
  local_228.x[1][1] = 26.0;
  local_228.x[1][2] = 248.0;
  local_228.x[1][3] = 26.0;
  local_228.x[2][0] = 10.0;
  testTinySVD_3x3<double>((Matrix33<double> *)&local_228);
  testTinySVD_3x3<double>
            (0.0023588321752040036,-0.009655813148072904,0.0010959850449366493,0.008867182960804475,
             0.0016771794267033666,-0.0043081475729438235,0.003976050440932701,0.0019880497026345716
             ,0.008957604661460197);
  testTinySVD_3x3<double>
            (2.3588321752040035e-09,-9.655813148072904e-09,1.0959850449366498e-09,
             8.867182960804475e-09,1.6771794267033661e-09,-4.3081475729438225e-09,
             3.976050440932702e-09,1.988049702634572e-09,8.957604661460196e-09);
  testTinySVD_3x3<double>
            (-0.46673855799602715,0.6746626036031095,0.97646986796449,-0.03246075374710372,
             0.04658452774941828,0.06743122864115114,-0.08888505522968781,0.1280389179308779,
             0.18532617511453064);
  testTinySVD_3x3<double>(1e-08,0.0,0.0,0.0,1e-08,0.0,0.0,0.0,1e-08);
  testTinySVD_3x3<double>(1.0,0.0,0.0,0.0,0.00036,0.0,1e-18,0.0,0.00018);
  testTinySVD_3x3<double>(1.3,0.0,0.0,0.0,0.0003,0.0,1e-17,0.0,0.0);
  testTinySVD_3x3<double>(1.0,0.0,0.0,0.0,0.01,0.0,0.0,0.0,0.01);
  testTinySVD_3x3<double>(1.0,0.0,0.0,0.0,1.0,0.0,0.0,0.0,0.0);
  testTinySVD_3x3<double>(1.0,0.0,0.0,0.0,0.001,0.0,0.0,0.0,1e-06);
  testTinySVD_3x3<double>
            (0.5958863857013633,-0.7976123412610779,-1.0,0.39194500425202045,0.9176311538344036,
             -0.341818175044664,-0.45056075218951946,-0.712590577274251,0.4712500821672027);
  testTinySVD_3x3<double>
            (4.38805348e-09,-2.53189691e-09,-4.65678607e-09,-3.23000099e-10,1.86370294e-10,
             3.42781192e-10,-4.61572824e-09,2.6632645e-09,4.89840346e-09);
  testTinySVD_3x3<double>(0.0,-1.00000003e-22,0.0,1.00000001e-07,0.0,0.0,0.0,0.0,0.0);
  testTinySVD_3x3<double>(0.0,-1.00000003e-22,0.0,1.00000001e-07,0.0,0.0,0.0,0.0,1.0);
  testTinySVD_4x4<double>(1.0,0.0,0.0,0.0,0.0,1.0,0.0,0.0,0.0,0.0,1.0,0.0,0.0,0.0,0.0,1.0);
  testTinySVD_4x4<double>(1.0,0.0,0.0,0.0,0.0,-1.0,0.0,0.0,0.0,0.0,1.0,0.0,0.0,0.0,0.0,1.0);
  testTinySVD_4x4<double>(1.0,0.0,0.0,0.0,0.0,1.0,0.0,0.0,0.0,0.0,1.0,0.0,0.0,0.0,0.0,0.0);
  testTinySVD_4x4<double>(1.0,0.0,0.0,0.0,0.0,1.0,0.0,0.0,0.0,0.0,0.0,0.0,0.0,0.0,0.0,0.0);
  testTinySVD_4x4<double>(0.0,0.0,0.0,0.0,0.0,0.0,0.0,0.0,0.0,0.0,0.0,0.0,0.0,0.0,0.0,0.0);
  testTinySVD_4x4<double>(1.0,0.0,0.0,0.0,0.0,0.0,0.0,0.0,0.0,0.0,0.0,0.0,0.0,0.0,0.0,0.0);
  testTinySVD_4x4<double>(1.0,2.0,3.0,4.0,5.0,6.0,7.0,8.0,9.0,10.0,11.0,12.0,13.0,14.0,15.0,16.0);
  testTinySVD_4x4<double>
            (0.0,-1.00000003e-22,0.0,0.0,1e-07,0.0,0.0,0.0,0.0,0.0,1.0,0.0,0.0,0.0,0.0,1.0);
  local_a8.x[0][0] = 100.0;
  local_a8.x[0][1] = 1e-05;
  local_a8.x[0][2] = 0.0;
  local_a8.x[0][3] = 0.0;
  local_128.x[0][0] = 100.0;
  local_128.x[0][1] = 1e-05;
  local_128.x[0][2] = 0.0;
  local_128.x[0][3] = 0.0;
  Imath_3_2::outerProduct<double>((Vec4<double> *)&local_a8,(Vec4<double> *)&local_128);
  testTinySVD_4x4<double>(&local_228);
  local_a8.x[0][0] = 245.0;
  local_a8.x[0][1] = 20.0;
  local_a8.x[0][2] = 1.0;
  local_a8.x[0][3] = 0.5;
  local_128.x[0][0] = 256.0;
  local_128.x[0][1] = 300.0;
  local_128.x[0][2] = 20.0;
  local_128.x[0][3] = 10.0;
  Imath_3_2::outerProduct<double>((Vec4<double> *)&local_a8,(Vec4<double> *)&local_128);
  testTinySVD_4x4<double>(&local_228);
  local_148.x = 245.0;
  local_148.y = 20.0;
  local_148.z = 1.0;
  local_148.w = 0.5;
  local_168.x = 256.0;
  local_168.y = 300.0;
  local_168.z = 20.0;
  local_168.w = 10.0;
  Imath_3_2::outerProduct<double>(&local_148,&local_168);
  local_188.x = 30.0;
  local_188.y = 10.0;
  local_188.z = 10.0;
  local_188.w = 10.0;
  local_1a8.x = 1.0;
  local_1a8.y = 2.0;
  local_1a8.z = 3.0;
  local_1a8.w = 3.0;
  Imath_3_2::outerProduct<double>(&local_188,&local_1a8);
  Imath_3_2::Matrix44<double>::operator+(&local_a8,&local_128);
  testTinySVD_4x4<double>(&local_228);
  return;
}

Assistant:

void
testTinySVDImp ()
{
    // Try a bunch of 3x3 matrices:
    testTinySVD_3x3<T> (1, 0, 0, 0, 1, 0, 0, 0, 1);
    testTinySVD_3x3<T> (1, 0, 0, 0, -1, 0, 0, 0, 1);
    testTinySVD_3x3<T> (0, 0, 0, 0, 0, 0, 0, 0, 0);
    testTinySVD_3x3<T> (0, 0, 0, 0, 0, 0, 0, 0, 1);
    testTinySVD_3x3<T> (1, 0, 0, 0, 1, 0, 0, 0, 0);
    testTinySVD_3x3<T> (1, 0, 0, 0, 0, 0, 0, 0, 0);
    testTinySVD_3x3<T> (1, 0, 0, T(1e-10), 0, 0, 0, 0, 0);
    testTinySVD_3x3<T> (1, 0, 0, T(1e-10), 0, 0, 0, 0, 100000);
    testTinySVD_3x3<T> (1, 2, 3, 4, 5, 6, 7, 8, 9);
    testTinySVD_3x3<T> (1, 2, 3, 4, 5, 6, 7, 8, 9);
    testTinySVD_3x3<T> (outerProduct (
        IMATH_INTERNAL_NAMESPACE::Vec3<T> (100, T(1e-5), 0),
        IMATH_INTERNAL_NAMESPACE::Vec3<T> (100, T(1e-5), 0)));
    testTinySVD_3x3<T> (outerProduct (
        IMATH_INTERNAL_NAMESPACE::Vec3<T> (245, 20, 1),
        IMATH_INTERNAL_NAMESPACE::Vec3<T> (256, 300, 20)));
    testTinySVD_3x3<T> (
        outerProduct (
            IMATH_INTERNAL_NAMESPACE::Vec3<T> (245, 20, 1),
            IMATH_INTERNAL_NAMESPACE::Vec3<T> (245, 20, 1)) +
        outerProduct (
            IMATH_INTERNAL_NAMESPACE::Vec3<T> (1, 2, 3),
            IMATH_INTERNAL_NAMESPACE::Vec3<T> (1, 2, 3)));

    // Some problematic matrices from SVDTest:
    testTinySVD_3x3<T> (
        T(0.0023588321752040036),
        T(-0.0096558131480729038),
        T(0.0010959850449366493),
        T(0.0088671829608044754),
        T(0.0016771794267033666),
        T(-0.0043081475729438235),
        T(0.003976050440932701),
        T(0.0019880497026345716),
        T(0.0089576046614601966));
    testTinySVD_3x3<T> (
        T(2.3588321752040035e-09),
        T(-9.6558131480729038e-09),
        T(1.0959850449366498e-09),
        T(8.8671829608044748e-09),
        T(1.6771794267033661e-09),
        T(-4.3081475729438225e-09),
        T(3.9760504409327016e-09),
        T(1.9880497026345722e-09),
        T(8.9576046614601957e-09));
    testTinySVD_3x3<T> (
        T(-0.46673855799602715),
        T(0.67466260360310948),
        T(0.97646986796448998),
        T(-0.032460753747103721),
        T(0.046584527749418278),
        T(0.067431228641151142),
        T(-0.088885055229687815),
        T(0.1280389179308779),
        T(0.18532617511453064));
    testTinySVD_3x3<T> (T(1e-8), 0, 0, 0, T(1e-8), 0, 0, 0, T(1e-8));
    testTinySVD_3x3<T> (1, 0, 0, 0, T(.00036), 0, T(1e-18), 0, T(.00018));
    testTinySVD_3x3<T> (T(1.3), 0, 0, 0, T(.0003), 0, T(1e-17), 0, 0);
    testTinySVD_3x3<T> (1, 0, 0, 0, T(1e-2), 0, 0, 0, T(1e-2));
    testTinySVD_3x3<T> (1, 0, 0, 0, 1, 0, 0, 0, 0);
    testTinySVD_3x3<T> (1, 0, 0, 0, T(1e-3), 0, 0, 0, T(1e-6));
    testTinySVD_3x3<T> (
        T(0.59588638570136332),
        T(-0.79761234126107794),
        -1,
        T(0.39194500425202045),
        T(0.91763115383440363),
        T(-0.341818175044664),
        T(-0.45056075218951946),
        T(-0.71259057727425101),
        T(0.47125008216720271));
    testTinySVD_3x3<T> (
        T(4.38805348e-09),
        T(-2.53189691e-09),
        T(-4.65678607e-09),
        T(-3.23000099e-10),
        T(1.86370294e-10),
        T(3.42781192e-10),
        T(-4.61572824e-09),
        T(2.6632645e-09),
        T(4.89840346e-09));
    // problematic 2x2 one for lapack on suse (see below), padded with 0's
    testTinySVD_3x3<T> (0, T(-1.00000003e-22), 0, T(1.00000001e-07), 0, 0, 0, 0, 0);
    // problematic 2x2 one for lapack on suse (see below), padded with 0's and 1
    testTinySVD_3x3<T> (0, T(-1.00000003e-22), 0, T(1.00000001e-07), 0, 0, 0, 0, 1);

    // Now, 4x4 matrices:
    testTinySVD_4x4<T> (1, 0, 0, 0, 0, 1, 0, 0, 0, 0, 1, 0, 0, 0, 0, 1);
    testTinySVD_4x4<T> (1, 0, 0, 0, 0, -1, 0, 0, 0, 0, 1, 0, 0, 0, 0, 1);
    testTinySVD_4x4<T> (1, 0, 0, 0, 0, 1, 0, 0, 0, 0, 1, 0, 0, 0, 0, 0);
    testTinySVD_4x4<T> (1, 0, 0, 0, 0, 1, 0, 0, 0, 0, 0, 0, 0, 0, 0, 0);
    testTinySVD_4x4<T> (0, 0, 0, 0, 0, 0, 0, 0, 0, 0, 0, 0, 0, 0, 0, 0);
    testTinySVD_4x4<T> (1, 0, 0, 0, 0, 0, 0, 0, 0, 0, 0, 0, 0, 0, 0, 0);
    testTinySVD_4x4<T> (1, 2, 3, 4, 5, 6, 7, 8, 9, 10, 11, 12, 13, 14, 15, 16);
    testTinySVD_4x4<T> (
        0,
        T(-1.00000003e-22),
        0,
        0,
        T(00000001e-07),
        0,
        0,
        0,
        0,
        0,
        1,
        0,
        0,
        0,
        0,
        1);
    testTinySVD_4x4<T> (outerProduct (
        IMATH_INTERNAL_NAMESPACE::Vec4<T> (100, T(1e-5), 0, 0),
        IMATH_INTERNAL_NAMESPACE::Vec4<T> (100, T(1e-5), 0, 0)));
    testTinySVD_4x4<T> (outerProduct (
        IMATH_INTERNAL_NAMESPACE::Vec4<T> (245, 20, 1, T(0.5)),
        IMATH_INTERNAL_NAMESPACE::Vec4<T> (256, 300, 20, 10)));
    testTinySVD_4x4<T> (
        outerProduct (
            IMATH_INTERNAL_NAMESPACE::Vec4<T> (245, 20, 1, T(0.5)),
            IMATH_INTERNAL_NAMESPACE::Vec4<T> (256, 300, 20, 10)) +
        outerProduct (
            IMATH_INTERNAL_NAMESPACE::Vec4<T> (30, 10, 10, 10),
            IMATH_INTERNAL_NAMESPACE::Vec4<T> (1, 2, 3, 3)));
}